

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O3

sc_unsigned * sc_dt::operator&(sc_unsigned *__return_storage_ptr__,sc_unsigned *u,uint64 v)

{
  small_type us;
  bool bVar1;
  ulong uVar2;
  sc_length_param *psVar3;
  size_t __n;
  ulong uVar4;
  sc_digit vd [3];
  
  us = u->sgn;
  if (v == 0 || us == 0) {
    psVar3 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_unsigned::sc_unsigned(__return_storage_ptr__,psVar3->m_len);
  }
  else {
    __n = 0xc;
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      vd[uVar4] = (uint)v & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar4) break;
      bVar1 = 0x3fffffff < v;
      uVar2 = uVar4 + 1;
      v = v >> 0x1e;
    } while (bVar1);
    if (uVar4 < 2) {
      memset(vd + uVar4 + 1,0,__n);
    }
    and_unsigned_friend(__return_storage_ptr__,us,u->nbits,u->ndigits,u->digit,1,0x40,3,vd);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_unsigned
operator&(const sc_unsigned& u, uint64 v)
{

  if ((u.sgn == SC_ZERO) || (v == 0)) // case 1
    return sc_unsigned();

  CONVERT_INT64(v);

  // other cases
  return and_unsigned_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                             vs, BITS_PER_UINT64, DIGITS_PER_UINT64, vd);

}